

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  _func_int *p_Var2;
  Layer *pLVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Option OVar11;
  undefined1 auVar12 [36];
  int i;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  pointer piVar19;
  undefined1 *puVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  undefined8 *puVar25;
  long lVar26;
  ulong uVar27;
  int i_1;
  uint uVar28;
  int i_3;
  int iVar29;
  pointer piVar30;
  int iVar31;
  uint uVar32;
  void *pvVar33;
  undefined1 *puVar34;
  ulong uVar35;
  int iVar36;
  undefined1 *puVar37;
  int outw;
  void *pvVar38;
  ulong uVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  int w_1;
  int w_3;
  int w;
  Option opt_q;
  void *local_208;
  allocator_type local_1f9;
  pointer local_1f8;
  void *local_1f0;
  void *local_1e8;
  Mat *local_1e0;
  pointer local_1d8;
  void *local_1d0;
  Convolution_x86_avx512 *local_1c8;
  undefined1 *local_1c0;
  Option *local_1b8;
  Mat *local_1b0;
  ulong local_1a8;
  Mat *local_1a0;
  undefined1 local_198 [32];
  Allocator *pAStack_178;
  undefined4 uStack_15c;
  size_t local_158;
  Mat local_148;
  Mat local_f8;
  ulong local_b0;
  undefined1 *local_a8;
  Mat *local_a0;
  void *local_98;
  int local_8c;
  undefined1 local_88 [56];
  int local_50;
  size_t local_48;
  long local_40;
  void *local_38;
  
  local_88._24_4_ = bottom_blob->elempack;
  if (local_88._24_4_ == 0) {
    bVar40 = false;
  }
  else {
    bVar40 = ((int)bottom_blob->elemsize << 3) / (int)local_88._24_4_ == 8;
  }
  piVar1 = bottom_blob->refcount;
  local_88._0_8_ = bottom_blob->data;
  local_88._8_4_ = SUB84(bottom_blob->refcount,0);
  local_88._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_88._16_8_ = bottom_blob->elemsize;
  local_88._32_8_ = bottom_blob->allocator;
  local_88._40_4_ = bottom_blob->dims;
  local_88._44_4_ = bottom_blob->w;
  local_88._48_4_ = bottom_blob->h;
  local_88._52_4_ = bottom_blob->d;
  local_50 = bottom_blob->c;
  local_48 = bottom_blob->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_1b8 = opt;
  if (!bVar40) {
    auVar42 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar42 = vmovdqu64_avx512f(auVar42);
    stack0xfffffffffffffe78 = auVar42._16_48_;
    local_198._0_8_ = auVar42._0_8_;
    local_198._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,(Mat *)local_88,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx512[-3]),
                     (Option *)local_198);
  }
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  local_1c8 = this;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx512 +
             (long)this->_vptr_Convolution_x86_avx512[-3]),(Mat *)local_88,&local_148,local_1b8);
  iVar18 = -100;
  if ((local_148.data == (void *)0x0) || ((long)local_148.c * local_148.cstep == 0))
  goto LAB_001f10f5;
  p_Var2 = local_1c8->_vptr_Convolution_x86_avx512[-3];
  iVar36 = (~((*(int *)(p_Var2 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data)) +
           local_148.w) / *(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data)
           + 1;
  iVar31 = (~((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data)) +
           local_148.h) / *(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data)
           + 1;
  local_8c = *(int *)(p_Var2 + 0x18 + (long)&(local_1c8->weight_winograd43_data).data);
  uVar28 = 1;
  if (local_1b8->use_packing_layout == true) {
    if (local_8c < 0x65) {
      uVar28 = (uint)((*(uint *)(p_Var2 + 0x28 + (long)&(local_1c8->weight_winograd23_data).data) &
                      3) == 0) * 3 + 1;
    }
    else {
      uVar28 = 1;
      if ((*(uint *)(p_Var2 + 0x28 + (long)&(local_1c8->weight_winograd23_data).data) & 7) == 0) {
        uVar28 = 8;
      }
    }
  }
  local_1a0 = (Mat *)CONCAT44(local_1a0._4_4_,local_148.elempack);
  local_98 = (void *)CONCAT44(local_98._4_4_,local_148.c);
  uVar23 = uVar28 * 4;
  if (100 < local_8c) {
    uVar23 = uVar28;
  }
  Mat::create(top_blob,iVar36,iVar31,
              *(int *)(p_Var2 + 0x28 + (long)&(local_1c8->weight_winograd23_data).data) /
              (int)uVar28,(ulong)uVar23,uVar28,local_1b8->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001f10f5;
  local_b0 = 1;
  if (local_1b8->use_packing_layout == true) {
    local_b0 = (ulong)((uint)(((byte)(local_1c8->_vptr_Convolution_x86_avx512[-3] + 0x28)
                                     [(long)&(local_1c8->weight_winograd23_data).data] & 3) == 0) *
                       3 + 1);
  }
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  iVar18 = (int)local_b0;
  local_a0 = top_blob;
  Mat::create(&local_f8,iVar36,iVar31,
              *(int *)(local_1c8->_vptr_Convolution_x86_avx512[-3] + 0x28 +
                      (long)&(local_1c8->weight_winograd23_data).data) / iVar18,
              (ulong)(uint)(iVar18 * 4),iVar18,local_1b8->workspace_allocator);
  iVar13 = local_f8.h;
  iVar36 = local_f8.w;
  iVar31 = local_148.c;
  OVar11 = _local_198;
  iVar18 = -100;
  if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
    if (((int)local_1a0 == 8) && ((int)local_b0 == 4)) {
      p_Var2 = local_1c8->_vptr_Convolution_x86_avx512[-3];
      uVar28 = *(uint *)(p_Var2 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data);
      if ((ulong)uVar28 == 1) {
        if ((((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if ((((uVar28 != 1) ||
               ((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
              || (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1))
             || ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                 (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 2))))
          goto LAB_001ef543;
          conv1x1s2_sgemm_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_001ef543:
        if ((((local_1b8->use_winograd_convolution == true) &&
             (((uVar28 == 3 && (local_1b8->use_winograd43_convolution != false)) &&
              (*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 3)))) &&
            (((*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) &&
           (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) {
          conv3x3s1_winograd43_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd43_data,local_1b8);
        }
        else {
          local_1f8 = (pointer)(ulong)*(uint *)(p_Var2 + 0x30 +
                                               (long)&(local_1c8->weight_winograd23_data).data);
          local_1c0 = (undefined1 *)
                      (long)*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data
                                    );
          iVar18 = *(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data);
          iVar29 = *(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
          local_1d8 = (pointer)(long)*(int *)(p_Var2 + 0x40 +
                                             (long)&(local_1c8->weight_winograd23_data).data);
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,local_148.w);
          uVar27 = (ulong)(uint)local_148.c;
          puVar34 = (undefined1 *)(ulong)(uint)local_f8.w;
          pvVar33 = (void *)(ulong)(uint)local_f8.h;
          uVar23 = *(uint *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar28;
          if (local_1b8->use_sgemm_convolution == true) {
            local_158 = 0;
            local_198._0_28_ = ZEXT1228((undefined1  [12])0x0);
            uStack_15c = OVar11._60_4_;
            _local_198 = ZEXT3260(local_198);
            Mat::create((Mat *)local_198,local_f8.h * local_f8.w,uVar23,local_148.c,8,8,
                        local_1b8->workspace_allocator);
            local_1e0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar31) {
              iVar31 = (int)local_1e8 * (int)local_1d8;
              local_1d0 = local_148.data;
              local_1d8 = (pointer)local_198._0_8_;
              local_1f0 = (void *)((long)local_148.w * (long)iVar18);
              local_208 = (void *)0x0;
              do {
                if (0 < (int)local_1f8) {
                  piVar30 = (pointer)(local_198._0_8_ +
                                     local_158 * (long)local_208 * local_198._16_8_);
                  local_1e8 = (void *)(local_148.elemsize * (long)local_1f0);
                  lVar21 = 0;
                  do {
                    if (0 < (int)uVar28) {
                      uVar14 = 0;
                      do {
                        if (0 < iVar13) {
                          puVar25 = (undefined8 *)
                                    ((long)local_148.data +
                                    uVar14 * (long)local_1c0 * 8 +
                                    (long)local_1e8 * lVar21 +
                                    local_148.cstep * (long)local_208 * local_148.elemsize);
                          uVar23 = 0;
                          do {
                            puVar20 = puVar34;
                            if (0 < iVar36) {
                              do {
                                *(undefined8 *)piVar30 = *puVar25;
                                piVar30 = piVar30 + 2;
                                puVar25 = puVar25 + iVar29;
                                uVar32 = (int)puVar20 - 1;
                                puVar20 = (undefined1 *)(ulong)uVar32;
                              } while (uVar32 != 0);
                            }
                            puVar25 = puVar25 + (iVar31 - iVar36 * iVar29);
                            uVar23 = uVar23 + 1;
                          } while (uVar23 != iVar13);
                        }
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != uVar28);
                    }
                    lVar21 = lVar21 + 1;
                  } while ((pointer)lVar21 != local_1f8);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while (local_208 != (void *)uVar27);
            }
            im2col_sgemm_pack8to4_int8_sse((Mat *)local_198,&local_f8,local_1e0,local_1b8);
            if ((Allocator *)local_198._8_8_ != (Allocator *)0x0) {
              LOCK();
              *(int *)(_func_int ***)local_198._8_8_ = *(int *)(_func_int ***)local_198._8_8_ + -1;
              UNLOCK();
              if (*(int *)(_func_int ***)local_198._8_8_ == 0) {
                if (pAStack_178 == (Allocator *)0x0) {
                  if ((pointer)local_198._0_8_ != (pointer)0x0) {
                    free((void *)local_198._0_8_);
                  }
                }
                else {
                  (*pAStack_178->_vptr_Allocator[3])();
                }
              }
            }
            auVar12 = stack0xfffffffffffffe84;
            local_158 = 0;
            local_198._0_12_ = SUB1612((undefined1  [16])0x0,0);
            local_198._0_28_ = ZEXT1228(local_198._0_12_);
            uStack_15c = auVar12._32_4_;
            _local_198 = ZEXT4060(_local_198);
          }
          else {
            local_1e0 = (Mat *)(ulong)(uint)local_f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_198,(long)(int)uVar23,&local_1f9);
            if (0 < (int)local_1f8) {
              iVar24 = 0;
              iVar15 = 0;
              iVar17 = 0;
              do {
                if (0 < (int)uVar28) {
                  lVar21 = 0;
                  do {
                    *(int *)(local_198._0_8_ + (iVar24 + lVar21) * 4) = iVar15;
                    iVar15 = iVar15 + (int)local_1c0;
                    lVar21 = lVar21 + 1;
                  } while (uVar28 != (uint)lVar21);
                  iVar24 = iVar24 + (uint)lVar21;
                }
                iVar15 = iVar15 + ((int)local_1e8 * iVar18 - (int)local_1c0 * uVar28);
                iVar17 = iVar17 + 1;
              } while (iVar17 != (int)local_1f8);
            }
            if (0 < (int)local_1e0) {
              local_1d0 = (void *)((long)iVar36 * 4);
              local_208 = (void *)0x0;
              do {
                if (0 < iVar13) {
                  local_1f8 = (pointer)(local_f8.cstep * (long)local_208 * local_f8.elemsize +
                                       (long)local_f8.data);
                  local_1f0 = (void *)0x0;
                  do {
                    if (0 < iVar36) {
                      local_1e8 = (void *)((long)local_1f0 * (long)local_1d8);
                      puVar20 = (undefined1 *)0x0;
                      do {
                        local_1c0 = puVar20;
                        if (iVar31 < 1) {
                          auVar49 = (undefined1  [16])0x0;
                          auVar41 = (undefined1  [16])0x0;
                          auVar46 = (undefined1  [16])0x0;
                          auVar43 = (undefined1  [16])0x0;
                        }
                        else {
                          pvVar38 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_208 *
                                             (local_1c8->weight_data_tm).elemsize +
                                            (long)(local_1c8->weight_data_tm).data);
                          auVar42 = ZEXT1664((undefined1  [16])0x0);
                          uVar14 = 0;
                          auVar48 = ZEXT1664((undefined1  [16])0x0);
                          auVar47 = ZEXT1664((undefined1  [16])0x0);
                          auVar45 = ZEXT1664((undefined1  [16])0x0);
                          do {
                            if (0 < (int)uVar23) {
                              lVar21 = 0;
                              do {
                                auVar49._8_8_ = 0;
                                auVar49._0_8_ =
                                     *(ulong *)((long)local_148.data +
                                               (long)*(int *)(local_198._0_8_ + lVar21) * 8 +
                                               local_148.cstep * local_148.elemsize * uVar14 +
                                               (long)(iVar29 * 8 * (int)local_1c0) +
                                               (long)local_148.w * (long)local_1e8 *
                                               local_148.elemsize);
                                auVar43 = vpcmpgtb_avx((undefined1  [16])0x0,auVar49);
                                auVar10 = vpunpcklbw_avx(auVar49,auVar43);
                                auVar43 = *(undefined1 (*) [16])((long)pvVar38 + lVar21 * 8);
                                auVar49 = *(undefined1 (*) [16])((long)pvVar38 + lVar21 * 8 + 0x10);
                                auVar41 = vpcmpgtb_avx((undefined1  [16])0x0,auVar43);
                                auVar46 = vpcmpgtb_avx((undefined1  [16])0x0,auVar49);
                                auVar44 = vpunpcklbw_avx(auVar43,auVar41);
                                auVar43 = vpunpckhbw_avx(auVar43,auVar41);
                                auVar41 = vpunpcklbw_avx(auVar49,auVar46);
                                auVar49 = vpunpckhbw_avx(auVar49,auVar46);
                                auVar6 = vpmullw_avx(auVar44,auVar10);
                                auVar44 = vpmulhw_avx(auVar44,auVar10);
                                auVar7 = vpmullw_avx(auVar10,auVar43);
                                auVar4 = vpmulhw_avx(auVar10,auVar43);
                                auVar8 = vpmullw_avx(auVar41,auVar10);
                                auVar5 = vpmulhw_avx(auVar41,auVar10);
                                auVar9 = vpmullw_avx(auVar10,auVar49);
                                auVar10 = vpmulhw_avx(auVar10,auVar49);
                                auVar43 = vpunpcklwd_avx(auVar6,auVar44);
                                auVar43 = vpaddd_avx(auVar42._0_16_,auVar43);
                                auVar49 = vpunpcklwd_avx(auVar7,auVar4);
                                auVar49 = vpaddd_avx(auVar48._0_16_,auVar49);
                                auVar41 = vpunpcklwd_avx(auVar8,auVar5);
                                auVar41 = vpaddd_avx(auVar47._0_16_,auVar41);
                                auVar46 = vpunpcklwd_avx(auVar9,auVar10);
                                auVar46 = vpaddd_avx(auVar45._0_16_,auVar46);
                                auVar44 = vpunpckhwd_avx(auVar6,auVar44);
                                auVar43 = vpaddd_avx(auVar43,auVar44);
                                auVar42 = ZEXT1664(auVar43);
                                auVar43 = vpunpckhwd_avx(auVar7,auVar4);
                                auVar43 = vpaddd_avx(auVar49,auVar43);
                                auVar48 = ZEXT1664(auVar43);
                                auVar43 = vpunpckhwd_avx(auVar8,auVar5);
                                auVar43 = vpaddd_avx(auVar41,auVar43);
                                auVar47 = ZEXT1664(auVar43);
                                auVar43 = vpunpckhwd_avx(auVar9,auVar10);
                                auVar43 = vpaddd_avx(auVar46,auVar43);
                                auVar45 = ZEXT1664(auVar43);
                                lVar21 = lVar21 + 4;
                              } while ((ulong)uVar23 << 2 != lVar21);
                              pvVar38 = (void *)((long)pvVar38 + (ulong)(uVar23 - 1) * 0x20 + 0x20);
                            }
                            auVar41 = auVar47._0_16_;
                            auVar49 = auVar45._0_16_;
                            auVar46 = auVar48._0_16_;
                            auVar43 = auVar42._0_16_;
                            uVar14 = uVar14 + 1;
                          } while (uVar14 != uVar27);
                        }
                        auVar44 = vpunpckldq_avx(auVar43,auVar46);
                        auVar4 = vpunpckldq_avx(auVar41,auVar49);
                        auVar46 = vpunpckhdq_avx(auVar43,auVar46);
                        auVar49 = vpunpckhdq_avx(auVar41,auVar49);
                        auVar41 = vpunpcklqdq_avx(auVar44,auVar4);
                        auVar43 = vpunpckhqdq_avx(auVar44,auVar4);
                        auVar43 = vpaddd_avx(auVar41,auVar43);
                        auVar41 = vpunpcklqdq_avx(auVar46,auVar49);
                        auVar49 = vpunpckhqdq_avx(auVar46,auVar49);
                        auVar49 = vpaddd_avx(auVar49,auVar41);
                        auVar43 = vpaddd_avx(auVar43,auVar49);
                        *(undefined1 (*) [16])(local_1f8 + (long)local_1c0 * 4) = auVar43;
                        puVar20 = local_1c0 + 1;
                      } while (local_1c0 + 1 != puVar34);
                    }
                    local_1f8 = local_1f8 + (long)iVar36 * 4;
                    local_1f0 = (void *)((long)local_1f0 + 1);
                  } while (local_1f0 != pvVar33);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while ((Mat *)local_208 != local_1e0);
            }
            if ((pointer)local_198._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
            }
          }
        }
      }
    }
    iVar36 = local_f8.h;
    iVar31 = local_f8.w;
    iVar18 = local_148.c;
    OVar11 = _local_198;
    if (((int)local_1a0 == 1) && ((int)local_b0 == 4)) {
      p_Var2 = local_1c8->_vptr_Convolution_x86_avx512[-3];
      uVar28 = *(uint *)(p_Var2 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data);
      puVar34 = (undefined1 *)(ulong)uVar28;
      if (puVar34 == (undefined1 *)0x1) {
        if ((((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_pack1to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if (((uVar28 != 1) ||
              ((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
             || ((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                 ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                  (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 2)))
                 ))) goto LAB_001efc20;
          conv1x1s2_sgemm_pack1to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_001efc20:
        if (uVar28 == 3) {
          if ((((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 3) &&
               (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
            conv3x3s1_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
          else {
            if ((((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 3)
                 || ((*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1
                     || (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data)
                         != 1)))) ||
                (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 2))
            goto LAB_001efcd0;
            conv3x3s2_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
        }
        else {
LAB_001efcd0:
          if ((((uVar28 == 7) &&
               (*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 7)) &&
              (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             (((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 2)) &&
              (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 2)))) {
            conv7x7s2_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
          else {
            local_1f0 = (void *)(ulong)*(uint *)(p_Var2 + 0x30 +
                                                (long)&(local_1c8->weight_winograd23_data).data);
            local_1e8 = (void *)(long)*(int *)(p_Var2 + 0x34 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
            local_1a8 = (ulong)*(int *)(p_Var2 + 0x38 +
                                       (long)&(local_1c8->weight_winograd23_data).data);
            iVar13 = *(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
            lVar21 = (long)iVar13;
            local_1d8 = (pointer)(long)*(int *)(p_Var2 + 0x40 +
                                               (long)&(local_1c8->weight_winograd23_data).data);
            local_1f8 = (pointer)CONCAT44(local_1f8._4_4_,local_148.w);
            puVar37 = (undefined1 *)(ulong)(uint)local_148.c;
            puVar20 = (undefined1 *)(long)local_f8.w;
            pvVar33 = (void *)(ulong)(uint)local_f8.h;
            uVar23 = *(uint *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) *
                     uVar28;
            if (local_1b8->use_sgemm_convolution == true) {
              local_158 = 0;
              local_198._0_28_ = ZEXT1228((undefined1  [12])0x0);
              uStack_15c = OVar11._60_4_;
              _local_198 = ZEXT3260(local_198);
              Mat::create((Mat *)local_198,local_f8.h * local_f8.w,uVar23,local_148.c,1,1,
                          local_1b8->workspace_allocator);
              local_1b0 = &local_1c8->weight_sgemm_data;
              if (0 < iVar18) {
                iVar18 = (int)local_1f8 * (int)local_1d8;
                local_1e0 = (Mat *)0x0;
                do {
                  if (0 < (int)local_1f0) {
                    local_1d0 = (void *)((long)local_148.data +
                                        local_148.cstep * (long)local_1e0 * local_148.elemsize);
                    piVar30 = (pointer)(local_158 * (long)local_1e0 * local_198._16_8_ +
                                       local_198._0_8_);
                    local_1d8 = (pointer)((long)local_148.w * local_148.elemsize * local_1a8);
                    pvVar33 = (void *)0x0;
                    do {
                      if (0 < (int)uVar28) {
                        local_1f8 = (pointer)((long)local_1d0 + (long)local_1d8 * (long)pvVar33);
                        lVar26 = 0;
                        do {
                          if (0 < iVar36) {
                            piVar19 = (pointer)((long)local_1f8 + lVar26 * (long)local_1e8);
                            uVar23 = 0;
                            do {
                              if (iVar31 < 4) {
                                uVar32 = 0;
                              }
                              else {
                                iVar29 = 3;
                                do {
                                  *(char *)piVar30 = (char)*piVar19;
                                  *(undefined1 *)((long)piVar30 + 1) =
                                       *(undefined1 *)((long)piVar19 + lVar21);
                                  *(undefined1 *)((long)piVar30 + 2) =
                                       *(undefined1 *)((long)piVar19 + (long)(iVar13 * 2));
                                  *(undefined1 *)((long)piVar30 + 3) =
                                       *(undefined1 *)((long)piVar19 + (long)(iVar13 * 3));
                                  piVar19 = piVar19 + lVar21;
                                  piVar30 = piVar30 + 1;
                                  iVar29 = iVar29 + 4;
                                  uVar32 = iVar31 & 0xfffffffc;
                                } while (iVar29 < iVar31);
                              }
                              uVar22 = uVar32 | 1;
                              while ((int)uVar22 < iVar31) {
                                *(char *)piVar30 = (char)*piVar19;
                                *(undefined1 *)((long)piVar30 + 1) =
                                     *(undefined1 *)((long)piVar19 + lVar21);
                                piVar19 = (pointer)((long)piVar19 + (long)(iVar13 * 2));
                                piVar30 = (pointer)((long)piVar30 + 2);
                                uVar22 = uVar32 + 3;
                                uVar32 = uVar32 + 2;
                              }
                              if ((int)uVar32 < iVar31) {
                                iVar29 = iVar31 - uVar32;
                                do {
                                  *(char *)piVar30 = (char)*piVar19;
                                  piVar19 = (pointer)((long)piVar19 + lVar21);
                                  piVar30 = (pointer)((long)piVar30 + 1);
                                  iVar29 = iVar29 + -1;
                                } while (iVar29 != 0);
                              }
                              piVar19 = (pointer)((long)piVar19 + (long)(iVar18 - iVar31 * iVar13));
                              uVar23 = uVar23 + 1;
                            } while (uVar23 != iVar36);
                          }
                          lVar26 = lVar26 + 1;
                        } while ((undefined1 *)lVar26 != puVar34);
                      }
                      pvVar33 = (void *)((long)pvVar33 + 1);
                    } while (pvVar33 != local_1f0);
                  }
                  local_1e0 = (Mat *)((long)&local_1e0->data + 1);
                  local_1c0 = puVar34;
                } while (local_1e0 != (Mat *)puVar37);
              }
              im2col_sgemm_pack1to4_int8_sse((Mat *)local_198,&local_f8,local_1b0,local_1b8);
              if ((Allocator *)local_198._8_8_ != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_198._8_8_ = *(int *)(_func_int ***)local_198._8_8_ + -1
                ;
                UNLOCK();
                if (*(int *)(_func_int ***)local_198._8_8_ == 0) {
                  if (pAStack_178 == (Allocator *)0x0) {
                    if ((pointer)local_198._0_8_ != (pointer)0x0) {
                      free((void *)local_198._0_8_);
                    }
                  }
                  else {
                    (*pAStack_178->_vptr_Allocator[3])();
                  }
                }
              }
              auVar12 = stack0xfffffffffffffe84;
              local_158 = 0;
              local_198._0_12_ = SUB1612((undefined1  [16])0x0,0);
              local_198._0_28_ = ZEXT1228(local_198._0_12_);
              uStack_15c = auVar12._32_4_;
              _local_198 = ZEXT4060(_local_198);
            }
            else {
              local_1e0 = (Mat *)(ulong)(uint)local_f8.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_198,(long)(int)uVar23,&local_1f9
                        );
              if (0 < (int)local_1f0) {
                iVar13 = 0;
                iVar29 = 0;
                iVar24 = 0;
                do {
                  if (0 < (int)uVar28) {
                    lVar21 = 0;
                    do {
                      *(int *)(local_198._0_8_ + (iVar13 + lVar21) * 4) = iVar29;
                      iVar29 = iVar29 + (int)local_1e8;
                      lVar21 = lVar21 + 1;
                    } while (uVar28 != (uint)lVar21);
                    iVar13 = iVar13 + (uint)lVar21;
                  }
                  iVar29 = iVar29 + ((int)local_1f8 * (int)local_1a8 - (int)local_1e8 * uVar28);
                  iVar24 = iVar24 + 1;
                } while (iVar24 != (int)local_1f0);
              }
              if (0 < (int)local_1e0) {
                local_1d0 = (void *)((long)puVar20 * 4);
                local_208 = (void *)0x0;
                do {
                  if (0 < iVar36) {
                    local_1f8 = (pointer)(local_f8.cstep * (long)local_208 * local_f8.elemsize +
                                         (long)local_f8.data);
                    local_1f0 = (void *)0x0;
                    do {
                      if (0 < iVar31) {
                        local_1e8 = (void *)((long)local_1f0 * (long)local_1d8);
                        puVar34 = (undefined1 *)0x0;
                        do {
                          local_1c0 = puVar34;
                          if (iVar18 < 1) {
                            auVar43 = (undefined1  [16])0x0;
                          }
                          else {
                            pvVar38 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_208 *
                                               (local_1c8->weight_data_tm).elemsize +
                                              (long)(local_1c8->weight_data_tm).data);
                            auVar42 = ZEXT1664((undefined1  [16])0x0);
                            lVar21 = 0;
                            do {
                              if (0 < (int)uVar23) {
                                uVar27 = 0;
                                do {
                                  auVar41 = vpbroadcastw_avx512vl();
                                  auVar46._8_8_ = 0;
                                  auVar46._0_8_ = *(ulong *)((long)pvVar38 + uVar27 * 4);
                                  auVar43 = vpcmpgtb_avx((undefined1  [16])0x0,auVar46);
                                  auVar43 = vpunpcklbw_avx(auVar46,auVar43);
                                  auVar49 = vpmullw_avx(auVar41,auVar43);
                                  auVar43 = vpmulhw_avx(auVar41,auVar43);
                                  auVar43 = vpunpcklwd_avx(auVar49,auVar43);
                                  auVar43 = vpaddd_avx(auVar42._0_16_,auVar43);
                                  auVar42 = ZEXT1664(auVar43);
                                  uVar27 = uVar27 + 1;
                                } while (uVar23 != uVar27);
                                pvVar38 = (void *)((long)pvVar38 + (ulong)(uVar23 - 1) * 4 + 4);
                              }
                              auVar43 = auVar42._0_16_;
                              lVar21 = lVar21 + 1;
                            } while ((undefined1 *)lVar21 != puVar37);
                          }
                          *(undefined1 (*) [16])(local_1f8 + (long)local_1c0 * 4) = auVar43;
                          puVar34 = local_1c0 + 1;
                        } while (local_1c0 + 1 != puVar20);
                      }
                      local_1f8 = local_1f8 + (long)puVar20 * 4;
                      local_1f0 = (void *)((long)local_1f0 + 1);
                    } while (local_1f0 != pvVar33);
                  }
                  local_208 = (void *)((long)local_208 + 1);
                } while ((Mat *)local_208 != local_1e0);
              }
              if ((pointer)local_198._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
              }
            }
          }
        }
      }
    }
    iVar31 = local_f8.w;
    iVar18 = local_148.c;
    OVar11 = _local_198;
    if (((int)local_1a0 == 8) && ((int)local_b0 == 1)) {
      p_Var2 = local_1c8->_vptr_Convolution_x86_avx512[-3];
      uVar28 = *(uint *)(p_Var2 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data);
      if ((ulong)uVar28 == 1) {
        if ((((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if (((uVar28 != 1) ||
              ((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
             || ((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                 ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                  (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 2)))
                 ))) goto LAB_001f037a;
          conv1x1s2_sgemm_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_001f037a:
        if (((local_1b8->use_winograd_convolution == true) &&
            (((((uVar28 == 3 && (local_1b8->use_winograd43_convolution != false)) &&
               (*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 3)) &&
              ((*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1))))
             && (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1))))
           && (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) {
          conv3x3s1_winograd43_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd43_data,local_1b8);
        }
        else {
          local_1f8 = (pointer)(ulong)*(uint *)(p_Var2 + 0x30 +
                                               (long)&(local_1c8->weight_winograd23_data).data);
          iVar36 = *(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data);
          iVar13 = *(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data);
          iVar29 = *(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
          local_1a8 = (ulong)*(int *)(p_Var2 + 0x40 +
                                     (long)&(local_1c8->weight_winograd23_data).data);
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,local_148.w);
          uVar27 = (ulong)(uint)local_148.c;
          uVar14 = (ulong)(uint)local_f8.w;
          local_1c0 = (undefined1 *)(ulong)(uint)local_f8.h;
          uVar23 = *(uint *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar28;
          if (local_1b8->use_sgemm_convolution == true) {
            local_158 = 0;
            local_198._0_28_ = ZEXT1228((undefined1  [12])0x0);
            uStack_15c = OVar11._60_4_;
            _local_198 = ZEXT3260(local_198);
            Mat::create((Mat *)local_198,local_f8.h * local_f8.w,uVar23,local_148.c,8,8,
                        local_1b8->workspace_allocator);
            local_1e0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar18) {
              iVar18 = (int)local_1e8 * (int)local_1a8;
              local_1d0 = local_148.data;
              local_1d8 = (pointer)local_198._0_8_;
              local_1f0 = (void *)((long)local_148.w * (long)iVar13);
              local_208 = (void *)0x0;
              do {
                if (0 < (int)local_1f8) {
                  piVar30 = (pointer)(local_198._0_8_ +
                                     local_158 * (long)local_208 * local_198._16_8_);
                  local_1e8 = (void *)(local_148.elemsize * (long)local_1f0);
                  lVar21 = 0;
                  do {
                    if (0 < (int)uVar28) {
                      uVar35 = 0;
                      do {
                        if (0 < (int)local_1c0) {
                          puVar25 = (undefined8 *)
                                    ((long)local_148.data +
                                    uVar35 * (long)iVar36 * 8 +
                                    (long)local_1e8 * lVar21 +
                                    local_148.cstep * (long)local_208 * local_148.elemsize);
                          iVar13 = 0;
                          do {
                            uVar16 = uVar14;
                            if (0 < iVar31) {
                              do {
                                *(undefined8 *)piVar30 = *puVar25;
                                piVar30 = piVar30 + 2;
                                puVar25 = puVar25 + iVar29;
                                uVar23 = (int)uVar16 - 1;
                                uVar16 = (ulong)uVar23;
                              } while (uVar23 != 0);
                            }
                            puVar25 = puVar25 + (iVar18 - iVar31 * iVar29);
                            iVar13 = iVar13 + 1;
                          } while (iVar13 != (int)local_1c0);
                        }
                        uVar35 = uVar35 + 1;
                      } while (uVar35 != uVar28);
                    }
                    lVar21 = lVar21 + 1;
                  } while ((pointer)lVar21 != local_1f8);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while (local_208 != (void *)uVar27);
            }
            im2col_sgemm_pack8to1_int8_sse((Mat *)local_198,&local_f8,local_1e0,local_1b8);
            if ((Allocator *)local_198._8_8_ != (Allocator *)0x0) {
              LOCK();
              *(int *)(_func_int ***)local_198._8_8_ = *(int *)(_func_int ***)local_198._8_8_ + -1;
              UNLOCK();
              if (*(int *)(_func_int ***)local_198._8_8_ == 0) {
                if (pAStack_178 == (Allocator *)0x0) {
                  if ((pointer)local_198._0_8_ != (pointer)0x0) {
                    free((void *)local_198._0_8_);
                  }
                }
                else {
                  (*pAStack_178->_vptr_Allocator[3])();
                }
              }
            }
            auVar12 = stack0xfffffffffffffe84;
            local_158 = 0;
            local_198._0_12_ = SUB1612((undefined1  [16])0x0,0);
            local_198._0_28_ = ZEXT1228(local_198._0_12_);
            uStack_15c = auVar12._32_4_;
            _local_198 = ZEXT4060(_local_198);
          }
          else {
            local_a8 = (undefined1 *)(ulong)(uint)local_f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_198,(long)(int)uVar23,&local_1f9);
            if (0 < (int)local_1f8) {
              iVar24 = 0;
              iVar15 = 0;
              iVar17 = 0;
              do {
                if (0 < (int)uVar28) {
                  lVar21 = 0;
                  do {
                    *(int *)(local_198._0_8_ + (iVar24 + lVar21) * 4) = iVar15;
                    iVar15 = iVar15 + iVar36;
                    lVar21 = lVar21 + 1;
                  } while (uVar28 != (uint)lVar21);
                  iVar24 = iVar24 + (uint)lVar21;
                }
                iVar15 = iVar15 + ((int)local_1e8 * iVar13 - iVar36 * uVar28);
                iVar17 = iVar17 + 1;
              } while (iVar17 != (int)local_1f8);
            }
            if (0 < (int)local_a8) {
              local_1e0 = (Mat *)(long)iVar31;
              local_38 = local_f8.data;
              local_40 = local_f8.elemsize * local_f8.cstep;
              local_1f8 = (pointer)((ulong)(uVar23 - 1) * 8 + 8);
              local_1b0 = (Mat *)0x0;
              do {
                if (0 < (int)local_1c0) {
                  local_1e8 = (void *)(local_40 * (long)local_1b0 + (long)local_f8.data);
                  local_1d0 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_1b0 *
                                       (local_1c8->weight_data_tm).elemsize +
                                      (long)(local_1c8->weight_data_tm).data);
                  local_1d8 = (pointer)0x0;
                  do {
                    if (0 < iVar31) {
                      local_1f0 = (void *)((long)local_1d8 * local_1a8 * local_148.elemsize);
                      uVar35 = 0;
                      do {
                        if (iVar18 < 1) {
                          iVar36 = 0;
                        }
                        else {
                          uVar16 = 0;
                          iVar36 = 0;
                          pvVar33 = local_1d0;
                          do {
                            if (0 < (int)uVar23) {
                              uVar39 = 0;
                              do {
                                auVar41._8_8_ = 0;
                                auVar41._0_8_ =
                                     *(ulong *)((long)local_148.data +
                                               (long)*(int *)(local_198._0_8_ + uVar39 * 4) * 8 +
                                               local_148.cstep * local_148.elemsize * uVar16 +
                                               (long)local_148.w * (long)local_1f0 +
                                               (long)(iVar29 * 8 * (int)uVar35));
                                auVar43 = vpcmpgtb_avx((undefined1  [16])0x0,auVar41);
                                auVar41 = vpunpcklbw_avx(auVar41,auVar43);
                                auVar44._8_8_ = 0;
                                auVar44._0_8_ = *(ulong *)((long)pvVar33 + uVar39 * 8);
                                auVar43 = vpcmpgtb_avx((undefined1  [16])0x0,auVar44);
                                auVar43 = vpunpcklbw_avx(auVar44,auVar43);
                                auVar49 = vpmullw_avx(auVar43,auVar41);
                                auVar43 = vpmulhw_avx(auVar41,auVar43);
                                auVar41 = vpunpcklwd_avx(auVar49,auVar43);
                                auVar43 = vpunpckhwd_avx(auVar49,auVar43);
                                auVar43 = vpaddd_avx(auVar41,auVar43);
                                auVar43 = vphaddd_avx(auVar43,auVar43);
                                auVar43 = vphaddd_avx(auVar43,auVar43);
                                iVar36 = iVar36 + auVar43._0_4_;
                                uVar39 = uVar39 + 1;
                              } while (uVar23 != uVar39);
                              pvVar33 = (void *)((long)pvVar33 + (long)local_1f8);
                            }
                            uVar16 = uVar16 + 1;
                          } while (uVar16 != uVar27);
                        }
                        *(int *)((long)local_1e8 + uVar35 * 4) = iVar36;
                        uVar35 = uVar35 + 1;
                      } while (uVar35 != uVar14);
                    }
                    local_1e8 = (void *)((long)local_1e8 + (long)local_1e0 * 4);
                    local_1d8 = (pointer)((long)local_1d8 + 1);
                  } while (local_1d8 != (pointer)local_1c0);
                }
                local_1b0 = (Mat *)((long)&local_1b0->data + 1);
              } while (local_1b0 != (Mat *)local_a8);
            }
            if ((pointer)local_198._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
            }
          }
        }
      }
    }
    iVar31 = local_f8.w;
    iVar18 = local_148.c;
    OVar11 = _local_198;
    if (((int)local_1a0 == 1) && ((int)local_b0 == 1)) {
      p_Var2 = local_1c8->_vptr_Convolution_x86_avx512[-3];
      uVar28 = *(uint *)(p_Var2 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data);
      pvVar33 = (void *)(ulong)uVar28;
      if (pvVar33 == (void *)0x1) {
        if ((((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_int8_sse(&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if ((((uVar28 != 1) ||
               ((*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                (*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
              || (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1))
             || ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                 (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 2))))
          goto LAB_001f09d7;
          conv1x1s2_sgemm_int8_sse(&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_001f09d7:
        if (((local_1b8->use_winograd_convolution == true) &&
            (((uVar28 == 3 && (local_1b8->use_winograd23_convolution != false)) &&
             (*(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 3)))) &&
           (((((*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
              (0xf < (int)local_98)))) &&
            (0xf < *(int *)(p_Var2 + 0x28 + (long)&(local_1c8->weight_winograd23_data).data))))) {
          conv3x3s1_winograd23_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd23_data,local_1b8);
        }
        else {
          local_1d0 = (void *)(ulong)*(uint *)(p_Var2 + 0x30 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
          iVar36 = *(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data);
          local_1b0 = (Mat *)(long)*(int *)(p_Var2 + 0x38 +
                                           (long)&(local_1c8->weight_winograd23_data).data);
          iVar13 = *(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
          lVar21 = (long)iVar13;
          local_1a8 = (ulong)*(int *)(p_Var2 + 0x40 +
                                     (long)&(local_1c8->weight_winograd23_data).data);
          local_1f0 = (void *)CONCAT44(local_1f0._4_4_,local_148.w);
          uVar27 = (ulong)(uint)local_148.c;
          pvVar38 = (void *)(long)local_f8.w;
          puVar34 = (undefined1 *)(ulong)(uint)local_f8.h;
          uVar23 = *(uint *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar28;
          local_1c0 = puVar34;
          if (local_1b8->use_sgemm_convolution == true) {
            local_158 = 0;
            local_198._0_28_ = ZEXT1228((undefined1  [12])0x0);
            uStack_15c = OVar11._60_4_;
            _local_198 = ZEXT3260(local_198);
            Mat::create((Mat *)local_198,local_f8.h * local_f8.w,uVar23,local_148.c,1,1,
                        local_1b8->workspace_allocator);
            local_1a0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar18) {
              iVar18 = (int)local_1f0 * (int)local_1a8;
              local_1a8 = 0;
              do {
                if (0 < (int)local_1d0) {
                  local_1d8 = (pointer)((long)local_148.data +
                                       local_148.cstep * local_1a8 * local_148.elemsize);
                  piVar30 = (pointer)(local_158 * local_1a8 * local_198._16_8_ + local_198._0_8_);
                  local_1e0 = (Mat *)((long)local_148.w * local_148.elemsize * (long)local_1b0);
                  pvVar38 = (void *)0x0;
                  do {
                    local_1f0 = pvVar38;
                    if (0 < (int)uVar28) {
                      local_1f8 = (pointer)((long)local_1d8 + (long)local_1e0 * (long)local_1f0);
                      pvVar38 = (void *)0x0;
                      do {
                        if (0 < (int)puVar34) {
                          piVar19 = (pointer)((long)local_1f8 + (long)pvVar38 * (long)iVar36);
                          iVar29 = 0;
                          do {
                            if (iVar31 < 4) {
                              uVar23 = 0;
                            }
                            else {
                              iVar24 = 3;
                              do {
                                *(char *)piVar30 = (char)*piVar19;
                                *(undefined1 *)((long)piVar30 + 1) =
                                     *(undefined1 *)((long)piVar19 + lVar21);
                                *(undefined1 *)((long)piVar30 + 2) =
                                     *(undefined1 *)((long)piVar19 + (long)(iVar13 * 2));
                                *(undefined1 *)((long)piVar30 + 3) =
                                     *(undefined1 *)((long)piVar19 + (long)(iVar13 * 3));
                                piVar19 = piVar19 + lVar21;
                                piVar30 = piVar30 + 1;
                                iVar24 = iVar24 + 4;
                                uVar23 = iVar31 & 0xfffffffc;
                              } while (iVar24 < iVar31);
                            }
                            uVar32 = uVar23 | 1;
                            while ((int)uVar32 < iVar31) {
                              *(char *)piVar30 = (char)*piVar19;
                              *(undefined1 *)((long)piVar30 + 1) =
                                   *(undefined1 *)((long)piVar19 + lVar21);
                              piVar19 = (pointer)((long)piVar19 + (long)(iVar13 * 2));
                              piVar30 = (pointer)((long)piVar30 + 2);
                              uVar32 = uVar23 + 3;
                              uVar23 = uVar23 + 2;
                            }
                            if ((int)uVar23 < iVar31) {
                              iVar24 = iVar31 - uVar23;
                              do {
                                *(char *)piVar30 = (char)*piVar19;
                                piVar19 = (pointer)((long)piVar19 + lVar21);
                                piVar30 = (pointer)((long)piVar30 + 1);
                                iVar24 = iVar24 + -1;
                              } while (iVar24 != 0);
                            }
                            piVar19 = (pointer)((long)piVar19 + (long)(iVar18 - iVar31 * iVar13));
                            iVar29 = iVar29 + 1;
                            puVar34 = local_1c0;
                          } while (iVar29 != (int)local_1c0);
                        }
                        pvVar38 = (void *)((long)pvVar38 + 1);
                      } while (pvVar38 != pvVar33);
                    }
                    pvVar38 = (void *)((long)local_1f0 + 1U);
                  } while ((void *)((long)local_1f0 + 1U) != local_1d0);
                }
                local_1a8 = local_1a8 + 1;
                local_1e8 = pvVar33;
              } while (local_1a8 != uVar27);
            }
            im2col_sgemm_int8_sse((Mat *)local_198,&local_f8,local_1a0,local_1b8);
            if ((Allocator *)local_198._8_8_ != (Allocator *)0x0) {
              LOCK();
              *(int *)(_func_int ***)local_198._8_8_ = *(int *)(_func_int ***)local_198._8_8_ + -1;
              UNLOCK();
              if (*(int *)(_func_int ***)local_198._8_8_ == 0) {
                if (pAStack_178 == (Allocator *)0x0) {
                  if ((pointer)local_198._0_8_ != (pointer)0x0) {
                    free((void *)local_198._0_8_);
                  }
                }
                else {
                  (*pAStack_178->_vptr_Allocator[3])();
                }
              }
            }
            auVar12 = stack0xfffffffffffffe84;
            local_158 = 0;
            local_198._0_12_ = SUB1612((undefined1  [16])0x0,0);
            local_198._0_28_ = ZEXT1228(local_198._0_12_);
            uStack_15c = auVar12._32_4_;
            _local_198 = ZEXT4060(_local_198);
          }
          else {
            local_1a0 = (Mat *)(ulong)(uint)local_f8.c;
            local_1f8 = (pointer)(long)(int)uVar23;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_198,(size_type)local_1f8,
                       &local_1f9);
            if (0 < (int)local_1d0) {
              iVar13 = 0;
              iVar29 = 0;
              iVar24 = 0;
              do {
                if (0 < (int)uVar28) {
                  lVar26 = 0;
                  do {
                    *(int *)(local_198._0_8_ + (iVar13 + lVar26) * 4) = iVar24;
                    iVar24 = iVar24 + iVar36;
                    lVar26 = lVar26 + 1;
                  } while (uVar28 != (uint)lVar26);
                  iVar13 = iVar13 + (uint)lVar26;
                }
                iVar24 = iVar24 + ((int)local_1f0 * (int)local_1b0 - iVar36 * uVar28);
                iVar29 = iVar29 + 1;
              } while (iVar29 != (int)local_1d0);
            }
            if (0 < (int)local_1a0) {
              local_98 = local_f8.data;
              local_b0 = local_f8.elemsize * local_f8.cstep;
              local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,iVar18 * uVar23);
              local_1b0 = (Mat *)0x0;
              do {
                if (0 < (int)puVar34) {
                  local_208 = (void *)(local_b0 * (long)local_1b0 + (long)local_f8.data);
                  local_1d8 = (pointer)((long)(int)(iVar18 * uVar23 * (int)local_1b0) +
                                       (long)(local_1c8->weight_data_tm).data);
                  local_1e0 = (Mat *)0x0;
                  do {
                    if (0 < iVar31) {
                      local_1f0 = local_148.data;
                      local_1d0 = (void *)((long)local_1e0 * local_1a8 * local_148.elemsize);
                      pvVar33 = (void *)0x0;
                      do {
                        local_1e8 = pvVar33;
                        if (iVar18 < 1) {
                          iVar36 = 0;
                        }
                        else {
                          uVar14 = 0;
                          iVar36 = 0;
                          piVar30 = local_1d8;
                          do {
                            if (0 < (int)uVar23) {
                              uVar35 = 0;
                              do {
                                iVar36 = iVar36 + (int)*(char *)((long)piVar30 + uVar35) *
                                                  (int)*(char *)((long)local_148.data +
                                                                (long)*(int *)(local_198._0_8_ +
                                                                              uVar35 * 4) +
                                                                local_148.cstep * local_148.elemsize
                                                                * uVar14 +
                                                                (long)local_148.w * (long)local_1d0
                                                                + (long)local_1e8 * lVar21);
                                uVar35 = uVar35 + 1;
                              } while (uVar23 != uVar35);
                            }
                            piVar30 = (pointer)((long)local_1f8 + (long)piVar30);
                            uVar14 = uVar14 + 1;
                          } while (uVar14 != uVar27);
                        }
                        *(int *)((long)local_208 + (long)local_1e8 * 4) = iVar36;
                        pvVar33 = (void *)((long)local_1e8 + 1U);
                      } while ((void *)((long)local_1e8 + 1U) != pvVar38);
                    }
                    local_208 = (void *)((long)local_208 + (long)pvVar38 * 4);
                    local_1e0 = (Mat *)((long)&local_1e0->data + 1);
                    puVar34 = local_1c0;
                  } while (local_1e0 != (Mat *)local_1c0);
                }
                local_1b0 = (Mat *)((long)&local_1b0->data + 1);
              } while (local_1b0 != local_1a0);
            }
            if ((pointer)local_198._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
            }
          }
        }
      }
    }
    p_Var2 = local_1c8->_vptr_Convolution_x86_avx512[-3];
    if (local_8c < 0x65) {
      dequantize_from_int32
                (&local_f8,local_a0,&local_1c8->scale_in_data,
                 (Mat *)(p_Var2 + 0x18 + (long)&(local_1c8->scale_in_data).data),local_1b8);
      pLVar3 = local_1c8->activation;
      iVar18 = 0;
      if (pLVar3 != (Layer *)0x0) {
        (*pLVar3->_vptr_Layer[9])(pLVar3,local_a0,local_1b8);
      }
    }
    else {
      iVar18 = 0;
      requantize_from_int32_to_int8
                (&local_f8,local_a0,&local_1c8->scale_in_data,
                 (Mat *)(&local_1c8->field_0x280 + (long)p_Var2),
                 (Mat *)(p_Var2 + 0x18 + (long)&(local_1c8->scale_in_data).data),
                 *(int *)(p_Var2 + 0x1c + (long)&(local_1c8->weight_winograd43_data).data),
                 (Mat *)(p_Var2 + 0x20 + (long)&(local_1c8->weight_winograd43_data).data),local_1b8)
      ;
    }
  }
  piVar1 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = 0;
  local_f8.elempack = 0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
LAB_001f10f5:
  piVar1 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  piVar1 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}